

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msc.h
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
msc::
mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
          (undefined8 param_1,double param_2,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,msc *this,msc *first,uint param_6,int dim)

{
  long lVar1;
  long lVar2;
  pointer pdVar3;
  long lVar4;
  pointer pvVar5;
  invalid_argument *this_00;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong __new_size;
  msc *pmVar9;
  double dVar10;
  double dVar11;
  vector<double,_std::allocator<double>_> point;
  void *local_48 [3];
  
  if (0 < (int)param_6) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(__return_storage_ptr__,((long)first - (long)this >> 3) * -0x5555555555555555,
             (allocator_type *)local_48);
    __new_size = (ulong)param_6;
    if (first != this) {
      lVar4 = 0;
      pmVar9 = this;
      do {
        lVar1 = *(long *)pmVar9;
        std::vector<double,_std::allocator<double>_>::resize
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar4,__new_size);
        lVar2 = *(long *)&(__return_storage_ptr__->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[lVar4].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar6 = 0;
        do {
          *(undefined8 *)(lVar2 + uVar6 * 8) = *(undefined8 *)(lVar1 + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (__new_size != uVar6);
        pmVar9 = pmVar9 + 0x18;
        lVar4 = lVar4 + 1;
      } while (pmVar9 != first);
    }
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
      uVar6 = 0;
      do {
        pdVar3 = pvVar5[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = 0;
        do {
          mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
                    (param_1,(msc *)local_48,pdVar3,this,first,param_6);
          dVar11 = 0.0;
          uVar7 = 0;
          do {
            dVar10 = pdVar3[uVar7] - *(double *)((long)local_48[0] + uVar7 * 8);
            dVar11 = dVar11 + dVar10 * dVar10;
            uVar7 = uVar7 + 1;
          } while (__new_size != uVar7);
          std::vector<double,_std::allocator<double>_>::operator=
                    ((__return_storage_ptr__->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar6,
                     (vector<double,_std::allocator<double>_> *)local_48);
          if (local_48[0] != (void *)0x0) {
            operator_delete(local_48[0]);
          }
        } while ((param_2 < dVar11) && (iVar8 = iVar8 + 1, iVar8 < dim));
        uVar6 = uVar6 + 1;
        pvVar5 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)(((long)(__return_storage_ptr__->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >>
                               3) * -0x5555555555555555));
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Dimension must be greater than 0");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline std::vector<std::vector<T>> mean_shift(
    ForwardIterator first, ForwardIterator last, int dim,
    Metric metric, Kernel kernel, Estimator estimator,
    double epsilon = std::numeric_limits<float>::epsilon(),
    int max_iter = std::numeric_limits<int>::max())
{
    if (dim <= 0)
        throw std::invalid_argument("Dimension must be greater than 0");
    typedef typename std::iterator_traits<ForwardIterator>::value_type C;
    std::vector<std::vector<T>> shifted(std::distance(first, last));
    std::size_t i = 0;
    for (auto it = first; it != last; it++, i++)
    {
        const T* pt = Accessor<T, C>::data(*it);
        shifted[i].resize(dim);
        for (int k = 0; k < dim; k++)
            shifted[i][k] = pt[k];
    }

    #pragma omp parallel for
    for (std::size_t i = 0; i < shifted.size(); i++)
    {
        const T* pt = shifted[i].data();
        int iter = 0;
        double d = 0;
        do
        {
            const auto point = mean_shift(
                pt, first, last, dim, metric, kernel, estimator);
            d = metric(pt, point.data(), dim);
            shifted[i] = point;
            iter++;
        }
        while (d > epsilon && iter < max_iter);
    }

    return shifted;
}